

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astc_codec.cpp
# Opt level: O0

astcenc_swizzle astcSwizzle(ktxAstcParams *params)

{
  initializer_list<astcenc_swz_*> __l;
  astcenc_swizzle aVar1;
  allocator<char> *__a;
  long lVar2;
  char *pcVar3;
  reference ppaVar4;
  long in_RDI;
  int i;
  string inputSwizzle;
  vector<astcenc_swz_*,_std::allocator<astcenc_swz_*>_> swizzle_array;
  astcenc_swizzle swizzle;
  vector<astcenc_swz_*,_std::allocator<astcenc_swz_*>_> *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  vector<astcenc_swz_*,_std::allocator<astcenc_swz_*>_> *in_stack_ffffffffffffff30;
  iterator in_stack_ffffffffffffff38;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  int local_b0;
  allocator<char> local_a9;
  string local_a8 [55];
  undefined1 local_71;
  undefined8 *local_70;
  long local_68;
  undefined8 local_60;
  long local_58;
  undefined8 **local_50;
  undefined8 local_48;
  vector<astcenc_swz_*,_std::allocator<astcenc_swz_*>_> local_40;
  undefined8 local_28;
  undefined8 uStack_20;
  long local_18;
  undefined4 local_10;
  undefined4 uStack_c;
  undefined4 local_8;
  astcenc_swz aStack_4;
  
  local_28 = 0x100000000;
  uStack_20 = 0x300000002;
  local_70 = &local_28;
  local_68 = (long)&local_28 + 4;
  local_60 = &uStack_20;
  local_58 = (long)&uStack_20 + 4;
  local_50 = &local_70;
  local_48 = 4;
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_71;
  local_18 = in_RDI;
  std::allocator<astcenc_swz_*>::allocator((allocator<astcenc_swz_*> *)0x48eb8c);
  __l._M_len = (size_type)this;
  __l._M_array = in_stack_ffffffffffffff38;
  std::vector<astcenc_swz_*,_std::allocator<astcenc_swz_*>_>::vector
            (in_stack_ffffffffffffff30,__l,
             (allocator_type *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  std::allocator<astcenc_swz_*>::~allocator((allocator<astcenc_swz_*> *)0x48ebbd);
  __a = (allocator<char> *)(local_18 + 0x1a);
  __s = &local_a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,__a);
  std::allocator<char>::~allocator(&local_a9);
  lVar2 = std::__cxx11::string::size();
  if (lVar2 == 0) {
    if ((*(byte *)(local_18 + 0x18) & 1) != 0) {
      local_10 = 0;
      uStack_c = 0;
      local_8 = 0;
      aStack_4 = ASTCENC_SWZ_G;
      goto LAB_0048eef0;
    }
  }
  else {
    lVar2 = std::__cxx11::string::size();
    if (lVar2 != 4) {
      __assert_fail("inputSwizzle.size() == 4 && \"InputSwizzle is invalid.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/astc_codec.cpp"
                    ,0x1ae,"astcenc_swizzle astcSwizzle(const ktxAstcParams &)");
    }
    for (local_b0 = 0; local_b0 < 4; local_b0 = local_b0 + 1) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_a8);
      if (*pcVar3 == 'r') {
        ppaVar4 = std::vector<astcenc_swz_*,_std::allocator<astcenc_swz_*>_>::operator[]
                            (&local_40,(long)local_b0);
        **ppaVar4 = ASTCENC_SWZ_R;
      }
      else {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_a8);
        if (*pcVar3 == 'g') {
          ppaVar4 = std::vector<astcenc_swz_*,_std::allocator<astcenc_swz_*>_>::operator[]
                              (&local_40,(long)local_b0);
          **ppaVar4 = ASTCENC_SWZ_G;
        }
        else {
          in_stack_ffffffffffffff10 =
               (vector<astcenc_swz_*,_std::allocator<astcenc_swz_*>_> *)
               std::__cxx11::string::operator[]((ulong)local_a8);
          if (*(char *)&(in_stack_ffffffffffffff10->
                        super__Vector_base<astcenc_swz_*,_std::allocator<astcenc_swz_*>_>)._M_impl.
                        super__Vector_impl_data._M_start == 'b') {
            ppaVar4 = std::vector<astcenc_swz_*,_std::allocator<astcenc_swz_*>_>::operator[]
                                (&local_40,(long)local_b0);
            **ppaVar4 = ASTCENC_SWZ_B;
          }
          else {
            pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_a8);
            if (*pcVar3 == 'a') {
              ppaVar4 = std::vector<astcenc_swz_*,_std::allocator<astcenc_swz_*>_>::operator[]
                                  (&local_40,(long)local_b0);
              **ppaVar4 = ASTCENC_SWZ_A;
            }
            else {
              pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_a8);
              if (*pcVar3 == '0') {
                ppaVar4 = std::vector<astcenc_swz_*,_std::allocator<astcenc_swz_*>_>::operator[]
                                    (&local_40,(long)local_b0);
                **ppaVar4 = ASTCENC_SWZ_0;
              }
              else {
                pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_a8);
                if (*pcVar3 == '1') {
                  ppaVar4 = std::vector<astcenc_swz_*,_std::allocator<astcenc_swz_*>_>::operator[]
                                      (&local_40,(long)local_b0);
                  **ppaVar4 = ASTCENC_SWZ_1;
                }
              }
            }
          }
        }
      }
    }
  }
  local_10 = (undefined4)local_28;
  uStack_c = (undefined4)((ulong)local_28 >> 0x20);
  local_8 = (undefined4)uStack_20;
  aStack_4 = (astcenc_swz)((ulong)uStack_20 >> 0x20);
LAB_0048eef0:
  std::__cxx11::string::~string(local_a8);
  std::vector<astcenc_swz_*,_std::allocator<astcenc_swz_*>_>::~vector(in_stack_ffffffffffffff10);
  aVar1.g = uStack_c;
  aVar1.r = local_10;
  aVar1.b = local_8;
  aVar1.a = aStack_4;
  return aVar1;
}

Assistant:

static astcenc_swizzle
astcSwizzle(const ktxAstcParams &params) {

    astcenc_swizzle swizzle{ASTCENC_SWZ_R, ASTCENC_SWZ_G, ASTCENC_SWZ_B, ASTCENC_SWZ_A};

    std::vector<astcenc_swz*> swizzle_array{&swizzle.r, &swizzle.g, &swizzle.b, &swizzle.a};
    std::string inputSwizzle = params.inputSwizzle;

    if (inputSwizzle.size() > 0) {
        assert(inputSwizzle.size() == 4 && "InputSwizzle is invalid.");

        for (int i = 0; i < 4; i++) {
            if (inputSwizzle[i] == 'r')
                *swizzle_array[i] = ASTCENC_SWZ_R;
            else if (inputSwizzle[i] == 'g')
                *swizzle_array[i] = ASTCENC_SWZ_G;
            else if (inputSwizzle[i] == 'b')
                *swizzle_array[i] = ASTCENC_SWZ_B;
            else if (inputSwizzle[i] == 'a')
                *swizzle_array[i] = ASTCENC_SWZ_A;
            else if (inputSwizzle[i] == '0')
                *swizzle_array[i] = ASTCENC_SWZ_0;
            else if (inputSwizzle[i] == '1')
                *swizzle_array[i] = ASTCENC_SWZ_1;
        }
    } else if (params.normalMap) {
        return {ASTCENC_SWZ_R, ASTCENC_SWZ_R, ASTCENC_SWZ_R, ASTCENC_SWZ_G};
    }

    return swizzle;
}